

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsat.hpp
# Opt level: O3

void __thiscall subsat::Solver::prepare_for_solving(Solver *this)

{
  pointer ppVar1;
  pointer puVar2;
  ConstraintRef CVar3;
  ulong in_RAX;
  ulong __new_size;
  uint32_t var_count;
  pointer ppVar4;
  undefined8 uStack_28;
  
  this->m_unassigned_vars = this->m_used_vars;
  uStack_28 = in_RAX;
  std::vector<subsat::VarInfo,_std::allocator<subsat::VarInfo>_>::resize
            (&(this->m_vars).m_data,(ulong)this->m_used_vars);
  uStack_28 = uStack_28 & 0xffffffffffffff;
  std::vector<signed_char,_std::allocator<signed_char>_>::resize
            (&(this->m_marks).m_data,(ulong)this->m_used_vars,(value_type *)((long)&uStack_28 + 7));
  uStack_28._0_7_ = (uint7)(uint6)uStack_28;
  std::vector<subsat::Value,_std::allocator<subsat::Value>_>::resize
            (&(this->m_values).m_data,(ulong)(this->m_used_vars * 2),
             (value_type *)((long)&uStack_28 + 6));
  var_count = this->m_used_vars;
  __new_size = (ulong)(var_count * 2);
  if ((ulong)(((long)(this->m_watches).m_data.
                     super__Vector_base<std::vector<subsat::Watch,_std::allocator<subsat::Watch>_>,_std::allocator<std::vector<subsat::Watch,_std::allocator<subsat::Watch>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_watches).m_data.
                     super__Vector_base<std::vector<subsat::Watch,_std::allocator<subsat::Watch>_>,_std::allocator<std::vector<subsat::Watch,_std::allocator<subsat::Watch>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) <
      __new_size) {
    std::
    vector<std::vector<subsat::Watch,_std::allocator<subsat::Watch>_>,_std::allocator<std::vector<subsat::Watch,_std::allocator<subsat::Watch>_>_>_>
    ::resize(&(this->m_watches).m_data,__new_size);
    var_count = this->m_used_vars;
    __new_size = (ulong)(var_count * 2);
  }
  if ((ulong)(((long)(this->m_watches_amo).m_data.
                     super__Vector_base<std::vector<subsat::Watch,_std::allocator<subsat::Watch>_>,_std::allocator<std::vector<subsat::Watch,_std::allocator<subsat::Watch>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_watches_amo).m_data.
                     super__Vector_base<std::vector<subsat::Watch,_std::allocator<subsat::Watch>_>,_std::allocator<std::vector<subsat::Watch,_std::allocator<subsat::Watch>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) <
      __new_size) {
    std::
    vector<std::vector<subsat::Watch,_std::allocator<subsat::Watch>_>,_std::allocator<std::vector<subsat::Watch,_std::allocator<subsat::Watch>_>_>_>
    ::resize(&(this->m_watches_amo).m_data,__new_size);
    var_count = this->m_used_vars;
  }
  DecisionQueue::resize_and_init(&this->m_queue,var_count);
  std::vector<subsat::Lit,_std::allocator<subsat::Lit>_>::reserve
            (&this->m_trail,(ulong)this->m_used_vars);
  ppVar4 = (this->m_original_constraints).
           super__Vector_base<std::pair<subsat::Constraint::Kind,_subsat::ConstraintRef>,_std::allocator<std::pair<subsat::Constraint::Kind,_subsat::ConstraintRef>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->m_original_constraints).
           super__Vector_base<std::pair<subsat::Constraint::Kind,_subsat::ConstraintRef>,_std::allocator<std::pair<subsat::Constraint::Kind,_subsat::ConstraintRef>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppVar4 == ppVar1) {
      uStack_28._0_6_ = (uint6)(uint5)uStack_28;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&(this->m_frames).m_data,(ulong)(this->m_used_vars + 1),
                 (value_type_conflict2 *)((long)&uStack_28 + 5));
      if ((this->tmp_propagate_binary_conflict_ref).m_index == 0xffffffff) {
        CVar3 = ConstraintArena::make_ref(&this->m_constraints);
        std::
        vector<unsigned_int,_default_init_allocator<unsigned_int,_std::allocator<unsigned_int>_>_>::
        resize(&(this->m_constraints).m_storage,
               ((long)(this->m_constraints).m_storage.
                      super__Vector_base<unsigned_int,_default_init_allocator<unsigned_int,_std::allocator<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_constraints).m_storage.
                      super__Vector_base<unsigned_int,_default_init_allocator<unsigned_int,_std::allocator<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 2) + 3);
        puVar2 = (this->m_constraints).m_storage.
                 super__Vector_base<unsigned_int,_default_init_allocator<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar2[(ulong)CVar3.m_index + 2] = 0xffffffff;
        puVar2 = puVar2 + CVar3.m_index;
        puVar2[0] = 2;
        puVar2[1] = 0xffffffff;
        (this->tmp_propagate_binary_conflict_ref).m_index = CVar3.m_index;
      }
      SubstitutionTheory::prepare_for_solving(&this->m_theory);
      theory_propagate_initial(this);
      return;
    }
    CVar3.m_index = (ppVar4->second).m_index;
    if (ppVar4->first == AtMostOne) {
      simplify_and_connect_atmostone_constraint(this,CVar3);
    }
    else if (ppVar4->first == Clause) {
      simplify_and_connect_clause(this,CVar3);
    }
    if (this->m_inconsistent != false) break;
    ppVar4 = ppVar4 + 1;
  }
  return;
}

Assistant:

void prepare_for_solving()
  {
    ASS_EQ(m_state, State::Unknown);
    ASS_EQ(m_level, 0);

    ASS_EQ(m_values.size(), 0);
    m_unassigned_vars = m_used_vars;
    m_vars.resize(m_used_vars);
    m_marks.resize(m_used_vars, 0);
    m_values.resize(2 * m_used_vars, Value::Unassigned);
    if (m_watches.size() < 2 * m_used_vars) {
      m_watches.resize(2 * m_used_vars);
    }
    if (m_watches_amo.size() < 2 * m_used_vars) {
      m_watches_amo.resize(2 * m_used_vars);
    }

#if SUBSAT_VDOM
    m_vdom.prepare_for_solving();
#endif
#if SUBSAT_VMTF
    m_queue.resize_and_init(m_used_vars);
    ASS(m_queue.checkInvariants(m_values));
#endif

    m_trail.reserve(m_used_vars);

    for (auto p : m_original_constraints) {
      Constraint::Kind const kind = p.first;
      ConstraintRef cr = p.second;
      switch (kind) {
        case Constraint::Kind::Clause:
          simplify_and_connect_clause(cr);
          break;
        case Constraint::Kind::AtMostOne:
          simplify_and_connect_atmostone_constraint(cr);
          break;
      }
      if (m_inconsistent) {
        // If we're inconsistent there's no point in further adding constraints
        return;
      }
    }

    m_frames.resize(m_used_vars + 1, 0);

    if (!tmp_propagate_binary_conflict_ref.is_valid()) {
      auto ca = alloc_constraint(2);
      handle_push_literal(ca, Lit::invalid());
      handle_push_literal(ca, Lit::invalid());
      tmp_propagate_binary_conflict_ref = handle_build(ca).m_ref;
    }

    m_theory.prepare_for_solving();
    theory_propagate_initial();
  }